

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

uint32 WAsmJs::ConvertOffset(uint32 offset,uint32 fromSize,uint32 toSize)

{
  unsigned_long uVar1;
  uint64 tmp;
  uint32 toSize_local;
  uint32 fromSize_local;
  uint32 offset_local;
  
  fromSize_local = offset;
  if (fromSize != toSize) {
    uVar1 = Math::Align<unsigned_long>((ulong)offset * (ulong)fromSize,(ulong)toSize);
    if (0xffffffff < uVar1 / toSize) {
      Math::DefaultOverflowPolicy();
    }
    fromSize_local = (uint32)(uVar1 / toSize);
  }
  return fromSize_local;
}

Assistant:

uint32 ConvertOffset(uint32 offset, uint32 fromSize, uint32 toSize)
    {
        if (fromSize == toSize)
        {
            return offset;
        }
        uint64 tmp = (uint64)offset * (uint64)fromSize;
        tmp = Math::Align<uint64>(tmp, toSize);
        tmp /= (uint64)toSize;
        if (tmp > (uint64)UINT32_MAX)
        {
            Math::DefaultOverflowPolicy();
        }
        return (uint32)tmp;
    }